

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_join_internal.h
# Opt level: O0

string * __thiscall
absl::lts_20240722::strings_internal::
JoinAlgorithm<google::protobuf::internal::RepeatedIterator<int_const>,absl::lts_20240722::strings_internal::AlphaNumFormatterImpl>
          (string *__return_storage_ptr__,strings_internal *this,RepeatedIterator<const_int> start,
          RepeatedIterator<const_int> end,string_view s,AlphaNumFormatterImpl *f)

{
  bool bVar1;
  const_pointer pvVar2;
  reference t;
  iterator local_58;
  RepeatedIterator<const_int> it;
  string_view sep;
  AlphaNumFormatterImpl *f_local;
  string_view s_local;
  RepeatedIterator<const_int> end_local;
  RepeatedIterator<const_int> start_local;
  string *result;
  
  s_local._M_len = s._M_len;
  s_local._M_str = (char *)start.it_;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&it,"");
  local_58.it_ = (pointer)this;
  while (bVar1 = google::protobuf::internal::operator!=(&local_58,(iterator *)&s_local._M_str),
        bVar1) {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&it);
    std::basic_string_view<char,_std::char_traits<char>_>::size
              ((basic_string_view<char,_std::char_traits<char>_> *)&it);
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pvVar2);
    t = google::protobuf::internal::RepeatedIterator<const_int>::operator*(&local_58);
    AlphaNumFormatterImpl::operator()((AlphaNumFormatterImpl *)s._M_str,__return_storage_ptr__,t);
    it = end;
    google::protobuf::internal::RepeatedIterator<const_int>::operator++(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JoinAlgorithm(Iterator start, Iterator end, absl::string_view s,
                          Formatter&& f) {
  std::string result;
  absl::string_view sep("");
  for (Iterator it = start; it != end; ++it) {
    result.append(sep.data(), sep.size());
    f(&result, *it);
    sep = s;
  }
  return result;
}